

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

longdouble * __thiscall
baryonyx::itm::quadratic_cost_type<long_double>::min
          (longdouble *__return_storage_ptr__,quadratic_cost_type<long_double> *this,int n)

{
  type plVar1;
  longdouble *plVar2;
  uint *puVar3;
  type pqVar4;
  unique_ptr<long_double[],_std::default_delete<long_double[]>_> *this_00;
  unique_ptr<baryonyx::itm::quadratic_cost_type<long_double>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
  *this_01;
  longdouble in_ST0;
  longdouble local_68;
  uint local_50;
  uint local_4c;
  int e;
  int i_1;
  int local_2c;
  undefined1 auStack_28 [4];
  int i;
  longdouble min;
  int local_14;
  longdouble *plStack_10;
  int n_local;
  quadratic_cost_type<long_double> *this_local;
  
  local_14 = (int)this;
  plStack_10 = __return_storage_ptr__;
  std::numeric_limits<long_double>::max();
  _auStack_28 = in_ST0;
  for (local_2c = 0; local_2c != local_14; local_2c = local_2c + 1) {
    plVar1 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                       ((unique_ptr<long_double[],_std::default_delete<long_double[]>_> *)
                        ((long)__return_storage_ptr__ + 8),(long)local_2c);
    if ((*plVar1 != (longdouble)0) || (NAN(*plVar1) || NAN((longdouble)0))) {
      this_00 = (unique_ptr<long_double[],_std::default_delete<long_double[]>_> *)
                ((long)__return_storage_ptr__ + 8);
      std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                (this_00,(long)local_2c);
      std::abs((int)this_00);
      plVar2 = std::min<long_double>((longdouble *)auStack_28,(longdouble *)&e);
      _auStack_28 = *plVar2;
    }
  }
  local_4c = 0;
  puVar3 = (uint *)std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                             ((unique_ptr<int[],_std::default_delete<int[]>_> *)
                              ((long)__return_storage_ptr__ + 0x18),(long)local_14);
  local_50 = *puVar3;
  for (; local_4c != local_50; local_4c = local_4c + 1) {
    pqVar4 = std::
             unique_ptr<baryonyx::itm::quadratic_cost_type<long_double>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::quadratic_cost_type<long_double>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
                           *)(__return_storage_ptr__ + 1),(long)(int)local_4c);
    if ((pqVar4->factor != (longdouble)0) || (NAN(pqVar4->factor) || NAN((longdouble)0))) {
      this_01 = (unique_ptr<baryonyx::itm::quadratic_cost_type<long_double>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
                 *)(__return_storage_ptr__ + 1);
      std::
      unique_ptr<baryonyx::itm::quadratic_cost_type<long_double>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
      ::operator[](this_01,(long)(int)local_4c);
      std::abs((int)this_01);
      plVar2 = std::min<long_double>((longdouble *)auStack_28,&local_68);
      _auStack_28 = *plVar2;
    }
  }
  return (longdouble *)(ulong)local_4c;
}

Assistant:

Float min(int n) const noexcept
    {
        Float min = std::numeric_limits<Float>::max();

        for (int i = 0; i != n; ++i)
            if (linear_elements[i])
                min = std::min(min, std::abs(linear_elements[i]));

        for (int i = 0, e = indices[n]; i != e; ++i)
            if (quadratic_elements[i].factor)
                min = std::min(min, std::abs(quadratic_elements[i].factor));

        return min;
    }